

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SkipData(CSzData *sd)

{
  ulong uStack_20;
  int __result__;
  UInt64 size;
  CSzData *sd_local;
  
  size = (UInt64)sd;
  sd_local._4_4_ = ReadNumber(sd,&stack0xffffffffffffffe0);
  if (sd_local._4_4_ == 0) {
    if (*(ulong *)(size + 8) < uStack_20) {
      sd_local._4_4_ = 0x10;
    }
    else {
      *(ulong *)(size + 8) = *(long *)(size + 8) - uStack_20;
      *(ulong *)size = uStack_20 + *(long *)size;
      sd_local._4_4_ = 0;
    }
  }
  return sd_local._4_4_;
}

Assistant:

static SRes SkipData(CSzData *sd)
{
  UInt64 size;
  RINOK(ReadNumber(sd, &size));
  if (size > sd->Size)
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, size);
  return SZ_OK;
}